

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O2

void __thiscall sjtu::TrainManager::delete_train(TrainManager *this,int argc,string *argv)

{
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *pBVar1;
  BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_> *this_00;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  pair<unsigned_int,_bool> pVar5;
  ostream *poVar6;
  invalid_command *this_01;
  long lVar7;
  long lVar8;
  char *pcVar9;
  TrainManager *pTVar10;
  pair<long,_bool> pVar11;
  allocator local_d9;
  TrainManager *local_d8;
  hashType local_d0;
  StringHasher *local_c8;
  long local_c0;
  char local_b8;
  string trainID;
  string local_90;
  string local_70;
  string local_50;
  
  trainID._M_dataplus._M_p = (pointer)&trainID.field_2;
  trainID._M_string_length = 0;
  trainID.field_2._M_local_buf[0] = '\0';
  lVar8 = 0;
  local_d8 = this;
  while( true ) {
    pTVar10 = local_d8;
    if (argc <= lVar8) {
      pBVar1 = local_d8->TrainBpTree;
      std::__cxx11::string::string((string *)&local_70,(string *)&trainID);
      local_c8 = (StringHasher *)&pTVar10->field_0x10;
      local_d0 = StringHasher::operator()(local_c8,&local_70);
      pVar11 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                         (pBVar1,&local_d0);
      local_c0 = pVar11.first;
      local_b8 = pVar11.second;
      std::__cxx11::string::~string((string *)&local_70);
      if (pVar11.second == false) {
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,-1);
        std::endl<char,std::char_traits<char>>(poVar6);
      }
      else {
        iVar4 = (*(pTVar10->TrainFile->super_FileManager_Base<sjtu::trainType>).
                  _vptr_FileManager_Base[2])(pTVar10->TrainFile,&local_c0);
        lVar8 = CONCAT44(extraout_var,iVar4);
        if (*(char *)(lVar8 + 0xa799) == '\0') {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = *(ulong *)(lVar8 + 0xa7a0);
          pcVar9 = (char *)(lVar8 + 0x20);
          for (lVar7 = 0; lVar7 < *(int *)(lVar8 + 0x18); lVar7 = lVar7 + 1) {
            this_00 = pTVar10->StationBpTree;
            std::__cxx11::string::string((string *)&local_50,pcVar9,&local_d9);
            local_d0 = StringHasher::operator()(local_c8,&local_50);
            pVar5 = BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>
                    ::find(this_00,&local_d0);
            std::__cxx11::string::~string((string *)&local_50);
            bitset_set(local_d8,pVar5.first,SUB164(auVar2 / ZEXT816(0xa7a8),0) - 1,0);
            pcVar9 = pcVar9 + 0x1a8;
            pTVar10 = local_d8;
          }
          pBVar1 = pTVar10->TrainBpTree;
          std::__cxx11::string::string((string *)&local_90,(string *)&trainID);
          local_d0 = StringHasher::operator()(local_c8,&local_90);
          BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::erase
                    (pBVar1,&local_d0);
          DynamicFileManager<sjtu::trainType>::release(pTVar10->TrainFile,local_c0);
          std::__cxx11::string::~string((string *)&local_90);
          iVar4 = 0;
        }
        else {
          iVar4 = -1;
        }
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
        std::endl<char,std::char_traits<char>>(poVar6);
      }
      std::__cxx11::string::~string((string *)&trainID);
      return;
    }
    bVar3 = std::operator==(argv,"-i");
    if (!bVar3) break;
    std::__cxx11::string::_M_assign((string *)&trainID);
    lVar8 = lVar8 + 2;
    argv = argv + 2;
  }
  this_01 = (invalid_command *)__cxa_allocate_exception(0x68);
  invalid_command::invalid_command(this_01);
  __cxa_throw(this_01,&invalid_command::typeinfo,invalid_command::~invalid_command);
}

Assistant:

void delete_train(int argc , std::string *argv)
		{
			std::string trainID;
			for (int i = 0;i < argc;i += 2)
				if (argv[i] == "-i") trainID = argv[i + 1];
				else throw invalid_command();
			auto ret = TrainBpTree -> find(hasher(trainID));
			if (ret.second == false) std::cout << -1 << std::endl;
			else
			{
				trainType *train = TrainFile -> read(ret.first);
				if (train -> is_released == true) std::cout << -1 << std::endl;
				else
				{
					for (int i = 0 , train_id = train -> offset / sizeof (DynamicFileManager<trainType>::valueType) - 1;i < train -> stationNum;++ i)
					{
						int id = StationBpTree -> find(hasher(train -> stations[i].stationName)).first;
						bitset_set(id , train_id , 0);
					}
					TrainBpTree -> erase(hasher(trainID)) , TrainFile -> release(ret.first);
					std::cout << 0 << std::endl;
				}
			}
		}